

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase827::run(TestCase827 *this)

{
  Builder builder;
  Builder builder_00;
  ClientHook *pCVar1;
  CapTableBuilder *pCVar2;
  RequestHook *pRVar3;
  SegmentBuilder *pSVar4;
  SegmentBuilder *pSVar5;
  CapTableBuilder *pCVar6;
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Reader value;
  Client client;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:839:38),_capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  promise;
  WaitScope waitScope;
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  request;
  EventLoop loop;
  undefined1 local_2c0 [8];
  Client local_2b8;
  PointerBuilder local_2a8;
  WaitScope local_288;
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  local_278;
  StructBuilder local_238;
  StructBuilder local_210;
  PointerBuilder local_1e8;
  WirePointer *in_stack_fffffffffffffe30;
  long in_stack_fffffffffffffe38;
  Disposer *in_stack_fffffffffffffe40;
  RequestHook *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  EventLoop local_78;
  Maybe<capnp::MessageSize> local_40;
  
  kj::EventLoop::EventLoop(&local_78);
  local_288.busyPollInterval = 0xffffffff;
  local_288.loop = &local_78;
  kj::EventLoop::enterScope(&local_78);
  Capability::Client::Client(&local_2b8,(void *)0x0);
  local_2c0 = (undefined1  [8])
              &capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::
               TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)::
               typeinfo;
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::callRequest
            (&local_278,(Client *)local_2c0,&local_40);
  local_1e8.pointer = local_278.super_Builder._builder.pointers + 1;
  local_1e8.segment = local_278.super_Builder._builder.segment;
  local_1e8.capTable = local_278.super_Builder._builder.capTable;
  value.super_StringPtr.content.size_ = 6;
  value.super_StringPtr.content.ptr = "hello";
  PointerBuilder::setBlob<capnp::Text>(&local_1e8,value);
  local_2a8.pointer = local_278.super_Builder._builder.pointers + 2;
  local_2a8.segment = local_278.super_Builder._builder.segment;
  local_2a8.capTable = local_278.super_Builder._builder.capTable;
  PointerBuilder::initStruct((StructBuilder *)&local_1e8,&local_2a8,(StructSize)0x20000);
  local_2a8.segment = local_1e8.segment;
  local_2a8.capTable = local_1e8.capTable;
  PointerBuilder::initStruct(&local_210,&local_2a8,(StructSize)0x140006);
  builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe38;
  builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe30;
  builder._builder.data = in_stack_fffffffffffffe40;
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffe48;
  builder._builder.dataSize = (int)in_stack_fffffffffffffe50;
  builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe50 >> 0x30);
  initTestMessage(builder);
  local_2a8.pointer = local_278.super_Builder._builder.pointers + 3;
  local_2a8.segment = local_278.super_Builder._builder.segment;
  local_2a8.capTable = local_278.super_Builder._builder.capTable;
  PointerBuilder::initStruct((StructBuilder *)&local_1e8,&local_2a8,(StructSize)0x20000);
  local_2a8.segment = local_1e8.segment;
  local_2a8.capTable = local_1e8.capTable;
  PointerBuilder::initStruct(&local_238,&local_2a8,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe38;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe30;
  builder_00._builder.data = in_stack_fffffffffffffe40;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffe48;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffe50;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe50 >> 0x30);
  initTestMessage(builder_00);
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  ::send((Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
          *)&local_1e8,(int)&local_278,__buf,in_RCX,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_1e8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:839:38),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:844:6)>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00608bd0;
  local_2a8.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::CallResults>,capnp::_::(anonymous_namespace)::TestCase827::run()::$_0,capnp::_::(anonymous_namespace)::TestCase827::run()::$_1>>
        ::instance;
  local_2a8.capTable = (CapTableBuilder *)this_00;
  if (in_stack_fffffffffffffe38 != 0) {
    (**in_stack_fffffffffffffe48->_vptr_RequestHook)
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe38,8,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe40,0,local_238.segment,local_238.capTable,local_238.data,
               local_238.pointers,local_238._32_8_);
  }
  if (in_stack_fffffffffffffe30 != (WirePointer *)0x0) {
    (**(code **)*local_1e8.pointer)
              (local_1e8.pointer,
               (long)&(in_stack_fffffffffffffe30->offsetAndKind).value +
               *(long *)(*(long *)&in_stack_fffffffffffffe30->offsetAndKind + -0x10));
  }
  pCVar2 = local_1e8.capTable;
  if (local_1e8.capTable != (CapTableBuilder *)0x0) {
    local_1e8.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1e8.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_1e8.segment,
               (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader);
  }
  local_1e8.segment = (SegmentBuilder *)((ulong)local_1e8.segment & 0xffffffffffffff00);
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)&local_2a8,(ExceptionOrValue *)&local_1e8,&local_288);
  if ((char)local_1e8.segment != '\0') {
    kj::throwRecoverableException((Exception *)&local_1e8.capTable,0);
    if ((char)local_1e8.segment == '\x01') {
      kj::Exception::~Exception((Exception *)&local_1e8.capTable);
    }
    (**(code **)(**(long **)(*(pointer_____offset_0x10___ *)((long)local_2c0 + -0x18) +
                            (long)&local_2b8.hook) + 0x20))(&local_1e8);
    pCVar2 = local_1e8.capTable;
    pSVar4 = local_1e8.segment;
    (**(code **)(**(long **)(*(pointer_____offset_0x10___ *)((long)local_2c0 + -0x18) +
                            (long)&local_2b8.hook) + 0x20))();
    pCVar6 = local_1e8.capTable;
    pSVar5 = local_1e8.segment;
    (**(code **)(**(long **)(*(pointer_____offset_0x10___ *)((long)local_2c0 + -0x18) +
                            (long)&local_2b8.hook) + 0x20))();
    if (local_1e8.capTable != (CapTableBuilder *)0x0) {
      (*(code *)(((local_1e8.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_1e8.segment,
                 ((local_1e8.capTable)->super_CapTableReader)._vptr_CapTableReader[-2] +
                 (long)&((local_1e8.capTable)->super_CapTableReader)._vptr_CapTableReader);
    }
    if (pCVar6 != (CapTableBuilder *)0x0) {
      (*(code *)((pSVar5->super_SegmentReader).arena)->_vptr_Arena)
                (pSVar5,(pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] +
                        (long)&(pCVar6->super_CapTableReader)._vptr_CapTableReader);
    }
    if (pCVar2 != (CapTableBuilder *)0x0) {
      (*(code *)((pSVar4->super_SegmentReader).arena)->_vptr_Arena)
                (pSVar4,(pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
                        (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader);
    }
    pCVar2 = local_2a8.capTable;
    if ((TransformPromiseNodeBase *)local_2a8.capTable != (TransformPromiseNodeBase *)0x0) {
      local_2a8.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_2a8.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_2a8.segment,
                 ((PromiseNode *)&pCVar2->super_CapTableReader)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pCVar2->super_CapTableReader)->_vptr_PromiseNode);
    }
    pRVar3 = local_278.hook.ptr;
    if (local_278.hook.ptr != (RequestHook *)0x0) {
      local_278.hook.ptr = (RequestHook *)0x0;
      (**(local_278.hook.disposer)->_vptr_Disposer)
                (local_278.hook.disposer,
                 pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
    }
    pCVar1 = local_2b8.hook.ptr;
    if (local_2b8.hook.ptr != (ClientHook *)0x0) {
      local_2b8.hook.ptr = (ClientHook *)0x0;
      (**(local_2b8.hook.disposer)->_vptr_Disposer)
                (local_2b8.hook.disposer,
                 pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
    }
    kj::EventLoop::leaveScope(local_288.loop);
    kj::EventLoop::~EventLoop(&local_78);
    return;
  }
  kj::_::unreachable();
}

Assistant:

TEST(Capability, Generics) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  typedef test::TestGenerics<TestAllTypes>::Interface<List<uint32_t>> Interface;
  Interface::Client client = nullptr;

  auto request = client.callRequest();
  request.setBaz("hello");
  initTestMessage(request.initInnerBound().initFoo());
  initTestMessage(request.initInnerUnbound().getFoo().initAs<TestAllTypes>());

  auto promise = request.send().then([](capnp::Response<Interface::CallResults>&& response) {
    // This doesn't actually execute; we're just checking that it compiles.
    List<uint32_t>::Reader qux = response.getQux();
    qux.size();
    checkTestMessage(response.getGen().getFoo());
  }, [](kj::Exception&& e) {
    // Ignore exception (which we'll always get because we're calling a null capability).
  });

  promise.wait(waitScope);

  // Check that asGeneric<>() compiles.
  test::TestGenerics<TestAllTypes>::Interface<>::Client castClient = client.asGeneric<>();
  test::TestGenerics<TestAllTypes>::Interface<TestAllTypes>::Client castClient2 =
      client.asGeneric<TestAllTypes>();
  test::TestGenerics<>::Interface<List<uint32_t>>::Client castClient3 = client.asTestGenericsGeneric<>();
}